

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O1

int __thiscall ncnn::ParamDict::load_param(ParamDict *this,uchar **mem)

{
  int iVar1;
  int *piVar2;
  Allocator *pAVar3;
  uchar *puVar4;
  void *pvVar5;
  void *pvVar6;
  int *piVar7;
  int *piVar8;
  int iVar9;
  Mat *pMVar10;
  size_t sVar11;
  size_t __n;
  
  clear(this);
  piVar2 = (int *)*mem;
  iVar1 = *piVar2;
  piVar8 = piVar2 + 1;
  *mem = (uchar *)piVar8;
  while (iVar1 != -0xe9) {
    iVar9 = -(iVar1 + 0x5b04);
    if (-0x5b04 < iVar1) {
      iVar9 = iVar1;
    }
    if (iVar1 < -0x5b03) {
      iVar1 = *piVar8;
      sVar11 = (size_t)iVar1;
      *mem = (uchar *)(piVar2 + 2);
      pMVar10 = &this->params[iVar9].v;
      if ((((this->params[iVar9].v.dims != 1) || (this->params[iVar9].v.w != iVar1)) ||
          (this->params[iVar9].v.elemsize != 4)) ||
         (this->params[iVar9].v.allocator != (Allocator *)0x0)) {
        piVar8 = this->params[iVar9].v.refcount;
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + -1;
          UNLOCK();
          if (*piVar8 == 0) {
            pAVar3 = this->params[iVar9].v.allocator;
            if (pAVar3 == (Allocator *)0x0) {
              if (pMVar10->data != (void *)0x0) {
                free(*(void **)((long)pMVar10->data + -8));
              }
            }
            else {
              (**(code **)(*(long *)pAVar3 + 8))();
            }
          }
        }
        pMVar10->data = (void *)0x0;
        this->params[iVar9].v.refcount = (int *)0x0;
        this->params[iVar9].v.elemsize = 0;
        this->params[iVar9].v.cstep = 0;
        this->params[iVar9].v.dims = 0;
        this->params[iVar9].v.w = 0;
        this->params[iVar9].v.h = 0;
        this->params[iVar9].v.c = 0;
        this->params[iVar9].v.elemsize = 4;
        this->params[iVar9].v.allocator = (Allocator *)0x0;
        this->params[iVar9].v.dims = 1;
        this->params[iVar9].v.w = iVar1;
        this->params[iVar9].v.h = 1;
        this->params[iVar9].v.c = 1;
        this->params[iVar9].v.cstep = sVar11;
        if (iVar1 != 0) {
          pvVar5 = malloc(sVar11 * 4 + 0x1c);
          pvVar6 = (void *)((long)pvVar5 + 0x17U & 0xfffffffffffffff0);
          *(void **)((long)pvVar6 - 8) = pvVar5;
          pMVar10->data = pvVar6;
          piVar8 = (int *)((long)pvVar6 + sVar11 * 4);
          this->params[iVar9].v.refcount = piVar8;
          *piVar8 = 1;
        }
      }
      __n = sVar11 << 2;
      memcpy(pMVar10->data,*mem,__n);
    }
    else {
      this->params[iVar9].field_1.i = *piVar8;
      __n = 4;
    }
    puVar4 = *mem;
    piVar2 = (int *)(puVar4 + __n);
    *mem = (uchar *)piVar2;
    this->params[iVar9].loaded = 1;
    piVar7 = (int *)(puVar4 + __n);
    piVar8 = piVar7 + 1;
    iVar1 = *piVar7;
    *mem = (uchar *)piVar8;
  }
  return 0;
}

Assistant:

int ParamDict::load_param(const unsigned char*& mem)
{
    clear();

    int id = *(int*)(mem);
    mem += 4;

    while (id != -233)
    {
        bool is_array = id <= -23300;
        if (is_array)
        {
            id = -id - 23300;
        }

        if (is_array)
        {
            int len = *(int*)(mem);
            mem += 4;

            params[id].v.create(len);

            memcpy(params[id].v.data, mem, len * 4);
            mem += len * 4;
        }
        else
        {
            params[id].f = *(float*)(mem);
            mem += 4;
        }

        params[id].loaded = 1;

        id = *(int*)(mem);
        mem += 4;
    }

    return 0;
}